

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_jnt_convolve_avx2.c
# Opt level: O1

void av1_highbd_dist_wtd_convolve_2d_avx2
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params,int bd)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  int16_t *piVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  char cVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 (*pauVar27) [32];
  undefined1 (*pauVar28) [16];
  byte bVar29;
  byte bVar30;
  uint uVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  int iVar35;
  ulong uVar36;
  int iVar37;
  long lVar38;
  undefined1 (*pauVar39) [32];
  undefined1 (*pauVar40) [16];
  undefined2 uVar41;
  int iVar42;
  int iVar43;
  long lVar44;
  undefined2 uVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [32];
  int16_t im_block [1120];
  undefined1 (*local_b68) [32];
  undefined1 (*local_b58) [16];
  undefined1 (*local_b50) [16];
  undefined1 local_920 [16];
  undefined1 auStack_910 [16];
  undefined1 local_900 [16];
  undefined1 auStack_8f0 [16];
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [16];
  undefined1 local_8c0 [16];
  undefined1 auStack_8b0 [2176];
  undefined1 auVar51 [32];
  
  bVar29 = (byte)conv_params->round_0;
  cVar14 = (char)bd;
  iVar43 = conv_params->round_1 + conv_params->round_0;
  bVar30 = (cVar14 + '\x0e') - (char)iVar43;
  uVar41 = 0xff;
  if (bd == 0xc) {
    uVar41 = 0xfff;
  }
  uVar45 = 0x3ff;
  if (bd != 10) {
    uVar45 = uVar41;
  }
  if (0 < w) {
    uVar5 = filter_params_y->taps;
    piVar8 = filter_params_y->filter_ptr;
    uVar36 = (ulong)((subpel_y_qn & 0xfU) * (uint)uVar5);
    uVar1 = *(undefined4 *)(piVar8 + uVar36 + 6);
    uVar2 = *(undefined4 *)(piVar8 + uVar36 + 4);
    auVar52._4_4_ = uVar2;
    auVar52._0_4_ = uVar2;
    auVar52._8_4_ = uVar2;
    auVar52._12_4_ = uVar2;
    auVar52._16_4_ = uVar2;
    auVar52._20_4_ = uVar2;
    auVar52._24_4_ = uVar2;
    auVar52._28_4_ = uVar2;
    uVar2 = *(undefined4 *)(piVar8 + uVar36 + 2);
    uVar3 = *(undefined4 *)(piVar8 + uVar36);
    auVar53._4_4_ = uVar3;
    auVar53._0_4_ = uVar3;
    auVar53._8_4_ = uVar3;
    auVar53._12_4_ = uVar3;
    auVar53._16_4_ = uVar3;
    auVar53._20_4_ = uVar3;
    auVar53._24_4_ = uVar3;
    auVar53._28_4_ = uVar3;
    iVar37 = ((1 << (bVar29 & 0x1f)) >> 1) + (1 << (cVar14 + 6U & 0x1f));
    iVar34 = ((1 << ((byte)conv_params->round_1 & 0x1f)) >> 1) +
             (-1 << (cVar14 + ~bVar29 + 0xe & 0x1f));
    local_b58 = (undefined1 (*) [16])conv_params->dst;
    iVar42 = (1 << (bVar30 - 1 & 0x1f)) + (1 << (bVar30 & 0x1f));
    iVar35 = (uint)uVar5 + h + -1;
    uVar31 = 0xe - iVar43;
    uVar36 = (ulong)((subpel_x_qn & 0xfU) * (uint)filter_params_x->taps);
    iVar43 = conv_params->fwd_offset;
    iVar4 = conv_params->bck_offset;
    auVar57._4_4_ = iVar37;
    auVar57._0_4_ = iVar37;
    auVar57._8_4_ = iVar37;
    auVar57._12_4_ = iVar37;
    auVar57._16_4_ = iVar37;
    auVar57._20_4_ = iVar37;
    auVar57._24_4_ = iVar37;
    auVar57._28_4_ = iVar37;
    uVar6 = conv_params->round_0;
    auVar47._4_4_ = iVar42;
    auVar47._0_4_ = iVar42;
    auVar47._8_4_ = iVar42;
    auVar47._12_4_ = iVar42;
    auVar47._16_4_ = iVar42;
    auVar47._20_4_ = iVar42;
    auVar47._24_4_ = iVar42;
    auVar47._28_4_ = iVar42;
    lVar44 = (long)conv_params->dst_stride;
    piVar8 = filter_params_x->filter_ptr;
    uVar3 = *(undefined4 *)(piVar8 + uVar36 + 6);
    auVar58._4_4_ = uVar3;
    auVar58._0_4_ = uVar3;
    auVar58._8_4_ = uVar3;
    auVar58._12_4_ = uVar3;
    auVar58._16_4_ = uVar3;
    auVar58._20_4_ = uVar3;
    auVar58._24_4_ = uVar3;
    auVar58._28_4_ = uVar3;
    uVar3 = *(undefined4 *)(piVar8 + uVar36 + 4);
    auVar59._4_4_ = uVar3;
    auVar59._0_4_ = uVar3;
    auVar59._8_4_ = uVar3;
    auVar59._12_4_ = uVar3;
    auVar59._16_4_ = uVar3;
    auVar59._20_4_ = uVar3;
    auVar59._24_4_ = uVar3;
    auVar59._28_4_ = uVar3;
    uVar3 = *(undefined4 *)(piVar8 + uVar36 + 2);
    auVar61._4_4_ = uVar3;
    auVar61._0_4_ = uVar3;
    auVar61._8_4_ = uVar3;
    auVar61._12_4_ = uVar3;
    auVar61._16_4_ = uVar3;
    auVar61._20_4_ = uVar3;
    auVar61._24_4_ = uVar3;
    auVar61._28_4_ = uVar3;
    uVar3 = *(undefined4 *)(piVar8 + uVar36);
    auVar60 = ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(uVar3,CONCAT412(
                                                  uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))))))));
    iVar37 = (1 << ((byte)uVar31 & 0x1f)) >> 1;
    auVar46._4_4_ = iVar37;
    auVar46._0_4_ = iVar37;
    auVar46._8_4_ = iVar37;
    auVar46._12_4_ = iVar37;
    auVar46._16_4_ = iVar37;
    auVar46._20_4_ = iVar37;
    auVar46._24_4_ = iVar37;
    auVar46._28_4_ = iVar37;
    iVar37 = conv_params->do_average;
    iVar42 = conv_params->use_dist_wtd_comp_avg;
    auVar46 = vpsubd_avx2(auVar46,auVar47);
    lVar38 = (long)dst_stride0;
    local_b68 = (undefined1 (*) [32])
                ((long)src +
                (2 - ((long)(int)(((uVar5 >> 1) - 1) * src_stride) * 2 +
                     (ulong)(filter_params_x->taps >> 1) * 2)));
    uVar36 = 0;
    uVar7 = conv_params->round_1;
    local_b50 = (undefined1 (*) [16])dst0;
    do {
      if (0 < iVar35) {
        pauVar27 = (undefined1 (*) [32])local_920;
        lVar33 = 1;
        pauVar39 = local_b68;
        do {
          auVar49 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          if (lVar33 < iVar35) {
            auVar49 = *(undefined1 (*) [32])(*pauVar39 + (long)src_stride * 2);
          }
          auVar55 = *pauVar39;
          auVar48._0_16_ = ZEXT116(0) * auVar49._0_16_ + ZEXT116(1) * auVar55._0_16_;
          auVar48._16_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar49._0_16_;
          auVar13 = vperm2i128_avx2(auVar55,auVar49,0x31);
          auVar49 = vpalignr_avx2(auVar13,auVar48,4);
          auVar55 = vpalignr_avx2(auVar13,auVar48,8);
          auVar9 = vpalignr_avx2(auVar13,auVar48,0xc);
          auVar10 = vpmaddwd_avx2(auVar60._0_32_,auVar48);
          auVar11 = vpmaddwd_avx2(auVar61,auVar49);
          auVar49 = vpmaddwd_avx2(auVar59,auVar55);
          auVar55 = vpmaddwd_avx2(auVar58,auVar9);
          auVar49 = vpaddd_avx2(auVar49,auVar55);
          auVar55 = vpaddd_avx2(auVar57,auVar10);
          auVar55 = vpaddd_avx2(auVar55,auVar11);
          auVar49 = vpaddd_avx2(auVar55,auVar49);
          auVar49 = vpsrad_avx2(auVar49,ZEXT416(uVar6));
          auVar49 = vpackssdw_avx2(auVar49,auVar13);
          auVar55 = vpalignr_avx2(auVar13,auVar48,2);
          auVar9 = vpalignr_avx2(auVar13,auVar48,6);
          auVar10 = vpalignr_avx2(auVar13,auVar48,10);
          auVar11 = vpalignr_avx2(auVar13,auVar48,0xe);
          auVar13 = vpmaddwd_avx2(auVar60._0_32_,auVar55);
          auVar55 = vpmaddwd_avx2(auVar61,auVar9);
          auVar9 = vpmaddwd_avx2(auVar59,auVar10);
          auVar55 = vpaddd_avx2(auVar55,auVar9);
          auVar10 = vpmaddwd_avx2(auVar58,auVar11);
          auVar9 = vpaddd_avx2(auVar57,auVar13);
          auVar55 = vpaddd_avx2(auVar9,auVar55);
          auVar55 = vpaddd_avx2(auVar55,auVar10);
          auVar55 = vpsrad_avx2(auVar55,ZEXT416(uVar6));
          auVar55 = vpackssdw_avx2(auVar55,auVar55);
          auVar49 = vpunpcklwd_avx2(auVar49,auVar55);
          *pauVar27 = auVar49;
          pauVar39 = (undefined1 (*) [32])(*pauVar39 + (long)src_stride * 4);
          pauVar27 = pauVar27 + 1;
          lVar32 = lVar33 + 1;
          lVar33 = lVar33 + 2;
        } while (lVar32 < iVar35);
      }
      if (0 < h) {
        auVar10._16_16_ = auStack_8d0;
        auVar10._0_16_ = local_8e0;
        auVar26._16_16_ = local_8c0;
        auVar26._0_16_ = auStack_8d0;
        auVar9 = vpunpckhwd_avx2(auVar10,auVar26);
        auVar11._16_16_ = auStack_8f0;
        auVar11._0_16_ = local_900;
        auVar25._16_16_ = local_8e0;
        auVar25._0_16_ = auStack_8f0;
        auVar49 = vpunpckhwd_avx2(auVar11,auVar25);
        auVar13._16_16_ = auStack_910;
        auVar13._0_16_ = local_920;
        auVar12._16_16_ = local_900;
        auVar12._0_16_ = auStack_910;
        auVar55 = vpunpckhwd_avx2(auVar13,auVar12);
        auVar10 = vpunpcklwd_avx2(auVar10,auVar26);
        auVar11 = vpunpcklwd_avx2(auVar11,auVar25);
        auVar13 = vpunpcklwd_avx2(auVar13,auVar12);
        pauVar27 = (undefined1 (*) [32])auStack_8b0;
        lVar33 = 0;
        pauVar28 = local_b58;
        pauVar40 = local_b50;
        do {
          auVar25 = auVar11;
          auVar26 = auVar49;
          auVar11 = auVar10;
          auVar10 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar27[-1] + 0x10),*pauVar27);
          auVar12 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar27[-1] + 0x10),*pauVar27);
          auVar23._4_4_ = uVar2;
          auVar23._0_4_ = uVar2;
          auVar23._8_4_ = uVar2;
          auVar23._12_4_ = uVar2;
          auVar23._16_4_ = uVar2;
          auVar23._20_4_ = uVar2;
          auVar23._24_4_ = uVar2;
          auVar23._28_4_ = uVar2;
          auVar49 = vpmaddwd_avx2(auVar25,auVar23);
          auVar48 = vpmaddwd_avx2(auVar11,auVar52);
          auVar49 = vpaddd_avx2(auVar48,auVar49);
          auVar13 = vpmaddwd_avx2(auVar53,auVar13);
          auVar22._4_4_ = iVar34;
          auVar22._0_4_ = iVar34;
          auVar22._8_4_ = iVar34;
          auVar22._12_4_ = iVar34;
          auVar22._16_4_ = iVar34;
          auVar22._20_4_ = iVar34;
          auVar22._24_4_ = iVar34;
          auVar22._28_4_ = iVar34;
          auVar13 = vpaddd_avx2(auVar22,auVar13);
          auVar49 = vpaddd_avx2(auVar13,auVar49);
          auVar24._4_4_ = uVar1;
          auVar24._0_4_ = uVar1;
          auVar24._8_4_ = uVar1;
          auVar24._12_4_ = uVar1;
          auVar24._16_4_ = uVar1;
          auVar24._20_4_ = uVar1;
          auVar24._24_4_ = uVar1;
          auVar24._28_4_ = uVar1;
          auVar13 = vpmaddwd_avx2(auVar10,auVar24);
          auVar49 = vpaddd_avx2(auVar49,auVar13);
          auVar49 = vpsrad_avx2(auVar49,ZEXT416(uVar7));
          auVar49 = vpaddd_avx2(auVar49,auVar47);
          if ((long)((ulong)(uint)w - 8) < (long)uVar36) {
            if (iVar37 == 0) {
              auVar49 = vpackusdw_avx2(auVar49,auVar25);
              *(long *)*pauVar28 = auVar49._0_8_;
              *(long *)(*pauVar28 + lVar44 * 2) = auVar49._16_8_;
            }
            else {
              auVar50._8_8_ = 0;
              auVar50._0_8_ = *(ulong *)(*pauVar28 + lVar44 * 2);
              auVar54._8_8_ = 0;
              auVar54._0_8_ = *(ulong *)*pauVar28;
              auVar51._0_16_ = ZEXT116(0) * auVar50 + ZEXT116(1) * auVar54;
              auVar51._16_16_ = ZEXT116(1) * auVar50;
              auVar55 = vpunpcklwd_avx2(auVar51,_DAT_005173a0);
              if (iVar42 == 0) {
                auVar49 = vpaddd_avx2(auVar55,auVar49);
                auVar49 = vpsrad_avx2(auVar49,1);
              }
              else {
                auVar18._4_4_ = iVar43;
                auVar18._0_4_ = iVar43;
                auVar18._8_4_ = iVar43;
                auVar18._12_4_ = iVar43;
                auVar18._16_4_ = iVar43;
                auVar18._20_4_ = iVar43;
                auVar18._24_4_ = iVar43;
                auVar18._28_4_ = iVar43;
                auVar55 = vpmulld_avx2(auVar55,auVar18);
                auVar15._4_4_ = iVar4;
                auVar15._0_4_ = iVar4;
                auVar15._8_4_ = iVar4;
                auVar15._12_4_ = iVar4;
                auVar15._16_4_ = iVar4;
                auVar15._20_4_ = iVar4;
                auVar15._24_4_ = iVar4;
                auVar15._28_4_ = iVar4;
                auVar49 = vpmulld_avx2(auVar49,auVar15);
                auVar49 = vpaddd_avx2(auVar55,auVar49);
                auVar49 = vpsrad_avx2(auVar49,4);
              }
              auVar49 = vpaddd_avx2(auVar49,auVar46);
              auVar49 = vpsrad_avx2(auVar49,ZEXT416(uVar31));
              auVar49 = vpackusdw_avx2(auVar49,auVar49);
              auVar21._2_2_ = uVar45;
              auVar21._0_2_ = uVar45;
              auVar21._4_2_ = uVar45;
              auVar21._6_2_ = uVar45;
              auVar21._8_2_ = uVar45;
              auVar21._10_2_ = uVar45;
              auVar21._12_2_ = uVar45;
              auVar21._14_2_ = uVar45;
              auVar21._16_2_ = uVar45;
              auVar21._18_2_ = uVar45;
              auVar21._20_2_ = uVar45;
              auVar21._22_2_ = uVar45;
              auVar21._24_2_ = uVar45;
              auVar21._26_2_ = uVar45;
              auVar21._28_2_ = uVar45;
              auVar21._30_2_ = uVar45;
              auVar49 = vpminsw_avx2(auVar49,auVar21);
              *(long *)*pauVar40 = auVar49._0_8_;
              *(long *)((long)*pauVar40 + lVar38 * 2) = auVar49._16_8_;
            }
          }
          else {
            auVar13 = vpmaddwd_avx2(auVar55,auVar53);
            auVar55 = vpmaddwd_avx2(auVar26,auVar23);
            auVar48 = vpmaddwd_avx2(auVar9,auVar52);
            auVar55 = vpaddd_avx2(auVar55,auVar48);
            auVar48 = vpmaddwd_avx2(auVar12,auVar24);
            auVar13 = vpaddd_avx2(auVar22,auVar13);
            auVar55 = vpaddd_avx2(auVar55,auVar13);
            auVar55 = vpaddd_avx2(auVar48,auVar55);
            auVar55 = vpsrad_avx2(auVar55,ZEXT416(uVar7));
            auVar55 = vpaddd_avx2(auVar47,auVar55);
            if (iVar37 == 0) {
              auVar49 = vpackusdw_avx2(auVar49,auVar55);
              *pauVar28 = auVar49._0_16_;
              *(undefined1 (*) [16])(*pauVar28 + lVar44 * 2) = auVar49._16_16_;
              auVar60 = ZEXT3264(auVar60._0_32_);
            }
            else {
              auVar56._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar28 + lVar44 * 2) +
                   ZEXT116(1) * *pauVar28;
              auVar56._16_16_ = ZEXT116(1) * *(undefined1 (*) [16])(*pauVar28 + lVar44 * 2);
              auVar13 = vpunpcklwd_avx2(auVar56,_DAT_005173a0);
              if (iVar42 == 0) {
                auVar49 = vpaddd_avx2(auVar49,auVar13);
                auVar49 = vpsrad_avx2(auVar49,1);
              }
              else {
                auVar19._4_4_ = iVar43;
                auVar19._0_4_ = iVar43;
                auVar19._8_4_ = iVar43;
                auVar19._12_4_ = iVar43;
                auVar19._16_4_ = iVar43;
                auVar19._20_4_ = iVar43;
                auVar19._24_4_ = iVar43;
                auVar19._28_4_ = iVar43;
                auVar13 = vpmulld_avx2(auVar13,auVar19);
                auVar16._4_4_ = iVar4;
                auVar16._0_4_ = iVar4;
                auVar16._8_4_ = iVar4;
                auVar16._12_4_ = iVar4;
                auVar16._16_4_ = iVar4;
                auVar16._20_4_ = iVar4;
                auVar16._24_4_ = iVar4;
                auVar16._28_4_ = iVar4;
                auVar49 = vpmulld_avx2(auVar49,auVar16);
                auVar49 = vpaddd_avx2(auVar13,auVar49);
                auVar49 = vpsrad_avx2(auVar49,4);
              }
              auVar60 = ZEXT3264(auVar60._0_32_);
              auVar13 = vpunpckhwd_avx2(auVar56,_DAT_005173a0);
              if (iVar42 == 0) {
                auVar55 = vpaddd_avx2(auVar55,auVar13);
                auVar55 = vpsrad_avx2(auVar55,1);
              }
              else {
                auVar20._4_4_ = iVar43;
                auVar20._0_4_ = iVar43;
                auVar20._8_4_ = iVar43;
                auVar20._12_4_ = iVar43;
                auVar20._16_4_ = iVar43;
                auVar20._20_4_ = iVar43;
                auVar20._24_4_ = iVar43;
                auVar20._28_4_ = iVar43;
                auVar13 = vpmulld_avx2(auVar13,auVar20);
                auVar17._4_4_ = iVar4;
                auVar17._0_4_ = iVar4;
                auVar17._8_4_ = iVar4;
                auVar17._12_4_ = iVar4;
                auVar17._16_4_ = iVar4;
                auVar17._20_4_ = iVar4;
                auVar17._24_4_ = iVar4;
                auVar17._28_4_ = iVar4;
                auVar55 = vpmulld_avx2(auVar55,auVar17);
                auVar55 = vpaddd_avx2(auVar55,auVar13);
                auVar55 = vpsrad_avx2(auVar55,4);
              }
              auVar49 = vpaddd_avx2(auVar46,auVar49);
              auVar13 = vpsrad_avx2(auVar49,ZEXT416(uVar31));
              auVar49 = vpaddd_avx2(auVar55,auVar46);
              auVar49 = vpsrad_avx2(auVar49,ZEXT416(uVar31));
              auVar49 = vpackusdw_avx2(auVar13,auVar49);
              auVar55._2_2_ = uVar45;
              auVar55._0_2_ = uVar45;
              auVar55._4_2_ = uVar45;
              auVar55._6_2_ = uVar45;
              auVar55._8_2_ = uVar45;
              auVar55._10_2_ = uVar45;
              auVar55._12_2_ = uVar45;
              auVar55._14_2_ = uVar45;
              auVar55._16_2_ = uVar45;
              auVar55._18_2_ = uVar45;
              auVar55._20_2_ = uVar45;
              auVar55._22_2_ = uVar45;
              auVar55._24_2_ = uVar45;
              auVar55._26_2_ = uVar45;
              auVar55._28_2_ = uVar45;
              auVar55._30_2_ = uVar45;
              auVar49 = vpminsw_avx2(auVar49,auVar55);
              *pauVar40 = auVar49._0_16_;
              *(undefined1 (*) [16])((long)*pauVar40 + lVar38 * 2) = auVar49._16_16_;
            }
          }
          lVar33 = lVar33 + 2;
          pauVar28 = (undefined1 (*) [16])(*pauVar28 + lVar44 * 4);
          pauVar40 = (undefined1 (*) [16])((long)*pauVar40 + lVar38 * 2 * 2);
          pauVar27 = pauVar27 + 1;
          auVar49 = auVar9;
          auVar9 = auVar12;
          auVar55 = auVar26;
          auVar13 = auVar25;
        } while (lVar33 < h);
      }
      uVar36 = uVar36 + 8;
      local_b68 = (undefined1 (*) [32])(*local_b68 + 0x10);
      local_b58 = local_b58 + 1;
      local_b50 = local_b50 + 1;
    } while (uVar36 < (uint)w);
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_2d_avx2(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int subpel_y_qn, ConvolveParams *conv_params, int bd) {
  DECLARE_ALIGNED(32, int16_t, im_block[(MAX_SB_SIZE + MAX_FILTER_TAP) * 8]);
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = 8;
  int i, j;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  __m256i s[8], coeffs_y[4], coeffs_x[4];
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m256i wt0 = _mm256_set1_epi32(w0);
  const __m256i wt1 = _mm256_set1_epi32(w1);
  const __m256i zero = _mm256_setzero_si256();

  const __m256i round_const_x = _mm256_set1_epi32(
      ((1 << conv_params->round_0) >> 1) + (1 << (bd + FILTER_BITS - 1)));
  const __m128i round_shift_x = _mm_cvtsi32_si128(conv_params->round_0);

  const __m256i round_const_y = _mm256_set1_epi32(
      ((1 << conv_params->round_1) >> 1) -
      (1 << (bd + 2 * FILTER_BITS - conv_params->round_0 - 1)));
  const __m128i round_shift_y = _mm_cvtsi32_si128(conv_params->round_1);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi32((1 << rounding_shift) >> 1);

  const __m256i clip_pixel_to_bd =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));

  prepare_coeffs(filter_params_x, subpel_x_qn, coeffs_x);
  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

  for (j = 0; j < w; j += 8) {
    /* Horizontal filter */
    {
      for (i = 0; i < im_h; i += 2) {
        const __m256i row0 =
            _mm256_loadu_si256((__m256i *)&src_ptr[i * src_stride + j]);
        __m256i row1 = _mm256_setzero_si256();
        if (i + 1 < im_h)
          row1 =
              _mm256_loadu_si256((__m256i *)&src_ptr[(i + 1) * src_stride + j]);

        const __m256i r0 = _mm256_permute2x128_si256(row0, row1, 0x20);
        const __m256i r1 = _mm256_permute2x128_si256(row0, row1, 0x31);

        // even pixels
        s[0] = _mm256_alignr_epi8(r1, r0, 0);
        s[1] = _mm256_alignr_epi8(r1, r0, 4);
        s[2] = _mm256_alignr_epi8(r1, r0, 8);
        s[3] = _mm256_alignr_epi8(r1, r0, 12);

        __m256i res_even = convolve(s, coeffs_x);
        res_even = _mm256_sra_epi32(_mm256_add_epi32(res_even, round_const_x),
                                    round_shift_x);

        // odd pixels
        s[0] = _mm256_alignr_epi8(r1, r0, 2);
        s[1] = _mm256_alignr_epi8(r1, r0, 6);
        s[2] = _mm256_alignr_epi8(r1, r0, 10);
        s[3] = _mm256_alignr_epi8(r1, r0, 14);

        __m256i res_odd = convolve(s, coeffs_x);
        res_odd = _mm256_sra_epi32(_mm256_add_epi32(res_odd, round_const_x),
                                   round_shift_x);

        __m256i res_even1 = _mm256_packs_epi32(res_even, res_even);
        __m256i res_odd1 = _mm256_packs_epi32(res_odd, res_odd);
        __m256i res = _mm256_unpacklo_epi16(res_even1, res_odd1);

        _mm256_store_si256((__m256i *)&im_block[i * im_stride], res);
      }
    }

    /* Vertical filter */
    {
      __m256i s0 = _mm256_loadu_si256((__m256i *)(im_block + 0 * im_stride));
      __m256i s1 = _mm256_loadu_si256((__m256i *)(im_block + 1 * im_stride));
      __m256i s2 = _mm256_loadu_si256((__m256i *)(im_block + 2 * im_stride));
      __m256i s3 = _mm256_loadu_si256((__m256i *)(im_block + 3 * im_stride));
      __m256i s4 = _mm256_loadu_si256((__m256i *)(im_block + 4 * im_stride));
      __m256i s5 = _mm256_loadu_si256((__m256i *)(im_block + 5 * im_stride));

      s[0] = _mm256_unpacklo_epi16(s0, s1);
      s[1] = _mm256_unpacklo_epi16(s2, s3);
      s[2] = _mm256_unpacklo_epi16(s4, s5);

      s[4] = _mm256_unpackhi_epi16(s0, s1);
      s[5] = _mm256_unpackhi_epi16(s2, s3);
      s[6] = _mm256_unpackhi_epi16(s4, s5);

      for (i = 0; i < h; i += 2) {
        const int16_t *data = &im_block[i * im_stride];

        const __m256i s6 =
            _mm256_loadu_si256((__m256i *)(data + 6 * im_stride));
        const __m256i s7 =
            _mm256_loadu_si256((__m256i *)(data + 7 * im_stride));

        s[3] = _mm256_unpacklo_epi16(s6, s7);
        s[7] = _mm256_unpackhi_epi16(s6, s7);

        const __m256i res_a = convolve(s, coeffs_y);

        const __m256i res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a, round_const_y), round_shift_y);

        const __m256i res_unsigned_lo =
            _mm256_add_epi32(res_a_round, offset_const);

        if (w - j < 8) {
          if (do_average) {
            const __m256i data_0 = _mm256_castsi128_si256(
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j])));
            const __m256i data_1 = _mm256_castsi128_si256(_mm_loadl_epi64(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
            const __m256i data_01 =
                _mm256_permute2x128_si256(data_0, data_1, 0x20);

            const __m256i data_ref_0 = _mm256_unpacklo_epi16(data_01, zero);

            const __m256i comp_avg_res =
                highbd_comp_avg(&data_ref_0, &res_unsigned_lo, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i round_result = highbd_convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_16b =
                _mm256_packus_epi32(round_result, round_result);
            const __m256i res_clip =
                _mm256_min_epi16(res_16b, clip_pixel_to_bd);

            const __m128i res_0 = _mm256_castsi256_si128(res_clip);
            const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_storel_epi64(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
          } else {
            __m256i res_16b =
                _mm256_packus_epi32(res_unsigned_lo, res_unsigned_lo);
            const __m128i res_0 = _mm256_castsi256_si128(res_16b);
            const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j]), res_0);
            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                             res_1);
          }
        } else {
          const __m256i res_b = convolve(s + 4, coeffs_y);
          const __m256i res_b_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_b, round_const_y), round_shift_y);

          __m256i res_unsigned_hi = _mm256_add_epi32(res_b_round, offset_const);

          if (do_average) {
            const __m256i data_0 = _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j])));
            const __m256i data_1 = _mm256_castsi128_si256(_mm_loadu_si128(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
            const __m256i data_01 =
                _mm256_permute2x128_si256(data_0, data_1, 0x20);

            const __m256i data_ref_0_lo = _mm256_unpacklo_epi16(data_01, zero);
            const __m256i data_ref_0_hi = _mm256_unpackhi_epi16(data_01, zero);

            const __m256i comp_avg_res_lo =
                highbd_comp_avg(&data_ref_0_lo, &res_unsigned_lo, &wt0, &wt1,
                                use_dist_wtd_comp_avg);
            const __m256i comp_avg_res_hi =
                highbd_comp_avg(&data_ref_0_hi, &res_unsigned_hi, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i round_result_lo =
                highbd_convolve_rounding(&comp_avg_res_lo, &offset_const,
                                         &rounding_const, rounding_shift);
            const __m256i round_result_hi =
                highbd_convolve_rounding(&comp_avg_res_hi, &offset_const,
                                         &rounding_const, rounding_shift);

            const __m256i res_16b =
                _mm256_packus_epi32(round_result_lo, round_result_hi);
            const __m256i res_clip =
                _mm256_min_epi16(res_16b, clip_pixel_to_bd);

            const __m128i res_0 = _mm256_castsi256_si128(res_clip);
            const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_store_si128(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
          } else {
            __m256i res_16b =
                _mm256_packus_epi32(res_unsigned_lo, res_unsigned_hi);
            const __m128i res_0 = _mm256_castsi256_si128(res_16b);
            const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        }

        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];
      }
    }
  }
}